

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

bool __thiscall
glslang::TParseContext::constructorTextureSamplerError
          (TParseContext *this,TSourceLoc *loc,TFunction *function)

{
  long *plVar1;
  TIntermediate *pTVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TSampler *pTVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar7;
  undefined4 extraout_var_04;
  mapped_type *pmVar8;
  undefined4 extraout_var_05;
  uint *puVar9;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  char *pcVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
  *this_00;
  _func_int **pp_Var11;
  bool bVar12;
  TSampler local_5c;
  TString constructorName;
  
  iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  TType::getBasicTypeString_abi_cxx11_(&constructorName,(TType *)CONCAT44(extraout_var,iVar4));
  iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  pp_Var11 = (function->super_TSymbol)._vptr_TSymbol;
  if (iVar4 == 1) {
    iVar4 = (*pp_Var11[0x28])(function,0);
    plVar1 = *(long **)(CONCAT44(extraout_var_00,iVar4) + 8);
    uVar5 = (**(code **)(*plVar1 + 0x38))(plVar1);
    bVar12 = true;
    if ((uVar5 & 0xfffffffe) == 8) {
      iVar4 = (**(code **)(*plVar1 + 0x60))(plVar1);
      bVar12 = iVar4 != 2;
    }
    iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_ARB_bindless_texture");
    if ((char)iVar4 != '\x01' || bVar12) {
      if ((char)iVar4 == '\0') {
        pcVar10 = "sampler-constructor requires the extension GL_ARB_bindless_texture enabled";
      }
      else {
        pcVar10 = "sampler-constructor requires the input to be ivec2 or uvec2";
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,pcVar10,constructorName._M_dataplus._M_p,"");
      return true;
    }
    pTVar6 = (TSampler *)(**(code **)(*plVar1 + 0x48))(plVar1);
    bVar12 = TSampler::isImage(pTVar6);
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    if (bVar12) {
      this_00 = &pTVar2->bindlessImageModeCaller;
    }
    else {
      this_00 = &pTVar2->bindlessTextureModeCaller;
    }
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
             ::operator[](this_00,&this->currentCaller);
    *pmVar8 = AstRefTypeFunc;
    return false;
  }
  iVar4 = (*pp_Var11[0x24])(function);
  if (iVar4 == 2) {
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
    cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0xe8))
                      ((long *)CONCAT44(extraout_var_01,iVar4));
    if (cVar3 == '\0') {
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,0);
      iVar4 = (**(code **)(**(long **)(CONCAT44(extraout_var_02,iVar4) + 8) + 0x38))();
      if (iVar4 == 0xe) {
        iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,0);
        lVar7 = (**(code **)(**(long **)(CONCAT44(extraout_var_03,iVar4) + 8) + 0x48))();
        if ((*(byte *)(lVar7 + 2) & 0x28) == 0) {
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,0);
          cVar3 = (**(code **)(**(long **)(CONCAT44(extraout_var_04,iVar4) + 8) + 0xe8))();
          if (cVar3 == '\0') {
            iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
            puVar9 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x40))
                                       ((long *)CONCAT44(extraout_var_05,iVar4));
            local_5c = (TSampler)(*puVar9 & 0xffedffff);
            iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,0);
            pTVar6 = (TSampler *)
                     (**(code **)(**(long **)(CONCAT44(extraout_var_06,iVar4) + 8) + 0x48))();
            bVar12 = TSampler::operator!=(&local_5c,pTVar6);
            if (bVar12) {
              pcVar10 = 
              "sampler-constructor first argument must be a *texture* type matching the dimensionality and sampled type of the constructor"
              ;
            }
            else {
              iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,1);
              iVar4 = (**(code **)(**(long **)(CONCAT44(extraout_var_07,iVar4) + 8) + 0x38))();
              pcVar10 = 
              "sampler-constructor second argument must be a scalar sampler or samplerShadow";
              if (iVar4 == 0xe) {
                iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,1);
                lVar7 = (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar4) + 8) + 0x48))();
                if ((*(byte *)(lVar7 + 2) & 0x20) != 0) {
                  iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,1);
                  cVar3 = (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar4) + 8) + 0xe8))();
                  if (cVar3 == '\0') {
                    return false;
                  }
                }
              }
            }
            pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            goto LAB_003a166e;
          }
        }
      }
      pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar10 = "sampler-constructor first argument must be a scalar *texture* type";
    }
    else {
      pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar10 = "sampler-constructor cannot make an array of samplers";
    }
  }
  else {
    pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar10 = "sampler-constructor requires two arguments";
  }
LAB_003a166e:
  (*pp_Var11[0x2d])(this,loc,pcVar10,constructorName._M_dataplus._M_p,"");
  return true;
}

Assistant:

bool TParseContext::constructorTextureSamplerError(const TSourceLoc& loc, const TFunction& function)
{
    TString constructorName = function.getType().getBasicTypeString();  // TODO: performance: should not be making copy; interface needs to change
    const char* token = constructorName.c_str();
    // verify the constructor for bindless texture, the input must be ivec2 or uvec2
    if (function.getParamCount() == 1) {
        TType* pType = function[0].type;
        TBasicType basicType = pType->getBasicType();
        bool isIntegerVec2 = ((basicType == EbtUint || basicType == EbtInt) && pType->getVectorSize() == 2);
        bool bindlessMode = extensionTurnedOn(E_GL_ARB_bindless_texture);
        if (isIntegerVec2 && bindlessMode) {
            if (pType->getSampler().isImage())
                intermediate.setBindlessImageMode(currentCaller, AstRefTypeFunc);
            else
                intermediate.setBindlessTextureMode(currentCaller, AstRefTypeFunc);
            return false;
        } else {
            if (!bindlessMode)
                error(loc, "sampler-constructor requires the extension GL_ARB_bindless_texture enabled", token, "");
            else
                error(loc, "sampler-constructor requires the input to be ivec2 or uvec2", token, "");
            return true;
        }
    }

    // exactly two arguments needed
    if (function.getParamCount() != 2) {
        error(loc, "sampler-constructor requires two arguments", token, "");
        return true;
    }

    // For now, not allowing arrayed constructors, the rest of this function
    // is set up to allow them, if this test is removed:
    if (function.getType().isArray()) {
        error(loc, "sampler-constructor cannot make an array of samplers", token, "");
        return true;
    }

    // first argument
    //  * the constructor's first argument must be a texture type
    //  * the dimensionality (1D, 2D, 3D, Cube, Rect, Buffer, MS, and Array)
    //    of the texture type must match that of the constructed sampler type
    //    (that is, the suffixes of the type of the first argument and the
    //    type of the constructor will be spelled the same way)
    if (function[0].type->getBasicType() != EbtSampler ||
        ! function[0].type->getSampler().isTexture() ||
        function[0].type->isArray()) {
        error(loc, "sampler-constructor first argument must be a scalar *texture* type", token, "");
        return true;
    }
    // simulate the first argument's impact on the result type, so it can be compared with the encapsulated operator!=()
    TSampler texture = function.getType().getSampler();
    texture.setCombined(false);
    texture.shadow = false;
    if (texture != function[0].type->getSampler()) {
        error(loc, "sampler-constructor first argument must be a *texture* type"
                   " matching the dimensionality and sampled type of the constructor", token, "");
        return true;
    }

    // second argument
    //   * the constructor's second argument must be a scalar of type
    //     *sampler* or *samplerShadow*
    if (  function[1].type->getBasicType() != EbtSampler ||
        ! function[1].type->getSampler().isPureSampler() ||
          function[1].type->isArray()) {
        error(loc, "sampler-constructor second argument must be a scalar sampler or samplerShadow", token, "");
        return true;
    }

    return false;
}